

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O0

bool_t PinToString(tchar_t *Value,size_t ValueLen,pin *Data)

{
  bool_t bVar1;
  size_t sVar2;
  size_t n;
  pin *Data_local;
  size_t ValueLen_local;
  tchar_t *Value_local;
  
  bVar1 = NodeToString(Value,ValueLen,Data->Node);
  if ((bVar1 != 0) && (Data->Node != (node *)0x0)) {
    if (*Value != '\0') {
      tcscat_s(Value,ValueLen,".");
    }
    sVar2 = strlen(Value);
    NodeParamName(Data->Node,Data->Id,Value + sVar2,ValueLen - sVar2);
  }
  return 1;
}

Assistant:

static bool_t PinToString(tchar_t* Value, size_t ValueLen, const pin* Data)
{
    if (NodeToString(Value,ValueLen,Data->Node) && Data->Node)
    {
        size_t n;
        if (Value[0])
            tcscat_s(Value,ValueLen,T("."));
        n = tcslen(Value);
        NodeParamName(Data->Node,Data->Id,Value+n,ValueLen-n);
    }

    return 1;
}